

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _dequeIterator.hpp
# Opt level: O2

dequeIterator<int,_64UL> * __thiscall
ft::dequeIterator<int,_64UL>::operator+=(dequeIterator<int,_64UL> *this,difference_type rhs)

{
  map_pointer ppvVar1;
  ulong uVar2;
  pointer pvVar3;
  ulong uVar4;
  
  uVar2 = ((long)this->m_cur - (long)this->m_first >> 2) + rhs;
  if ((long)uVar2 < 0) {
    uVar4 = (long)uVar2 >> 6;
  }
  else {
    if (uVar2 < 0x40) {
      pvVar3 = this->m_cur + rhs;
      goto LAB_001071e9;
    }
    uVar4 = uVar2 >> 6;
  }
  ppvVar1 = this->m_node;
  this->m_node = ppvVar1 + uVar4;
  pvVar3 = ppvVar1[uVar4];
  this->m_first = pvVar3;
  this->m_last = pvVar3 + 0x40;
  pvVar3 = pvVar3 + uVar2 + uVar4 * -0x40;
LAB_001071e9:
  this->m_cur = pvVar3;
  return this;
}

Assistant:

dequeIterator&	operator+=(difference_type rhs) {
		difference_type	offset = rhs + (this->m_cur - this->m_first);
		if (offset >= 0 && offset < difference_type(this->chunk_size()))
			this->m_cur += rhs;
		else {
			difference_type	node_offset;
			if (offset > 0) node_offset = offset / difference_type(this->chunk_size());
			else node_offset = -((-offset - 1) / difference_type(this->chunk_size())) -1;

			this->setNode(this->m_node + node_offset);
			this->m_cur = this->m_first + (offset - node_offset * this->chunk_size());
		}
		return *this;
	}